

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# udp.c
# Opt level: O3

int uv__udp_recv_stop(uv_udp_t *handle)

{
  uint *puVar1;
  uint uVar2;
  int iVar3;
  
  uv__io_stop(handle->loop,&handle->io_watcher,1);
  iVar3 = uv__io_active(&handle->io_watcher,4);
  if (((iVar3 == 0) && (uVar2 = handle->flags, (uVar2 >> 0xe & 1) != 0)) &&
     (handle->flags = uVar2 & 0xffffbfff, (uVar2 >> 0xd & 1) != 0)) {
    puVar1 = &handle->loop->active_handles;
    *puVar1 = *puVar1 - 1;
  }
  handle->alloc_cb = (uv_alloc_cb)0x0;
  handle->recv_cb = (uv_udp_recv_cb)0x0;
  return 0;
}

Assistant:

int uv__udp_recv_stop(uv_udp_t* handle) {
  uv__io_stop(handle->loop, &handle->io_watcher, POLLIN);

  if (!uv__io_active(&handle->io_watcher, POLLOUT))
    uv__handle_stop(handle);

  handle->alloc_cb = NULL;
  handle->recv_cb = NULL;

  return 0;
}